

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

Clause * Inferences::resolveClausesHelper
                   (InductionContext *context,Stack<Kernel::Clause_*> *cls,ElementIterator eIt,
                   Substitution *subst,bool generalized,bool applySubst,Substitution *indLitSubst)

{
  uint uVar1;
  Stack<Kernel::Clause_*> *pSVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Clause **ppCVar6;
  Elem ppLVar7;
  Literal **ppLVar8;
  RobSubstitution *this;
  Clause *pCVar9;
  Stack<Kernel::Clause_*> *in_RSI;
  long in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  long in_stack_00000010;
  TermReplacement tr_2;
  Literal *l;
  Literal *rlit;
  TermReplacement tr_1;
  Literal **lit_1;
  Literal **__end3_1;
  Literal **__begin3_1;
  Stack<Kernel::Literal_*> *__range3_1;
  bool copyCurr;
  uint i;
  value_type *kv_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *__range1_2;
  TermReplacement tr;
  Literal *resLit;
  Literal *slit;
  Literal **lit;
  Literal **__end3;
  Literal **__begin3;
  Stack<Kernel::Literal_*> *__range3;
  value_type *kv_1;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *__range2;
  bool contains;
  Literal *clit;
  Literal *curr;
  StlIter __end1_1;
  StlIter __begin1_1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1_1;
  RStack<Literal_*> resLits;
  Inference inf;
  value_type *kv;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *__range1;
  Clause *other;
  unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
  *toResolve;
  List<Kernel::Unit_*> *premises;
  Clause *cl;
  RobSubstitution renaming;
  StlIter *in_stack_fffffffffffffae8;
  Unit *in_stack_fffffffffffffaf0;
  map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
  *in_stack_fffffffffffffaf8;
  Clause *in_stack_fffffffffffffb00;
  GeneratingInferenceMany *in_stack_fffffffffffffb08;
  RobSubstitution *in_stack_fffffffffffffb10;
  Literal *in_stack_fffffffffffffb28;
  Literal *in_stack_fffffffffffffb30;
  Inference *in_stack_fffffffffffffb58;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffb60;
  RobSubstitution *in_stack_fffffffffffffb68;
  Literal *in_stack_fffffffffffffb70;
  InductionContext *in_stack_fffffffffffffb78;
  InferenceRule local_44a;
  InferenceRule local_449;
  Inference local_408 [3];
  Literal *local_370;
  int local_364;
  Literal *local_360;
  Literal **local_2f0;
  Literal **local_2e8;
  Literal **local_2e0;
  Stack<Kernel::Literal_*> *local_2d8;
  byte local_2cd;
  uint local_2cc;
  reference local_2c8;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_2c0;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_2b8;
  long local_2b0;
  RobSubstitution *local_240;
  InductionContext *local_238;
  Literal **local_230;
  Literal **local_228;
  Literal **local_220;
  Stack<Kernel::Literal_*> *local_218;
  reference local_210;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_208;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_200;
  long local_1f8;
  byte local_1e9;
  InductionContext *local_1e8;
  RobSubstitution *local_1e0;
  undefined1 local_1b8 [24];
  undefined1 *local_1a0;
  GeneratingInferenceMany local_188;
  Inference local_178;
  reference local_148;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_140;
  _Node_iterator_base<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_true>
  local_138;
  long local_130;
  Clause *local_128;
  long local_120;
  List<Kernel::Unit_*> *local_118;
  Clause *local_100;
  byte local_2a;
  byte local_29;
  Stack<Kernel::Clause_*> *local_20;
  long local_18;
  ElementIterator local_10;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_20 = in_RSI;
  local_18 = in_RDI;
  Kernel::RobSubstitution::RobSubstitution(in_stack_fffffffffffffb10);
  pSVar2 = local_20;
  iVar4 = Lib::IntUnionFind::ElementIterator::next(&local_10);
  ppCVar6 = Lib::Stack<Kernel::Clause_*>::operator[](pSVar2,(long)iVar4);
  local_100 = *ppCVar6;
  local_118 = Lib::List<Kernel::Unit_*>::singleton(&in_stack_fffffffffffffb00->super_Unit);
  local_120 = local_18 + 0x18;
  while (bVar3 = Lib::IntUnionFind::ElementIterator::hasNext(&local_10), pSVar2 = local_20, bVar3) {
    iVar4 = Lib::IntUnionFind::ElementIterator::next(&local_10);
    ppCVar6 = Lib::Stack<Kernel::Clause_*>::operator[](pSVar2,(long)iVar4);
    local_128 = *ppCVar6;
    Lib::List<Kernel::Unit_*>::push
              (in_stack_fffffffffffffaf0,(List<Kernel::Unit_*> **)in_stack_fffffffffffffae8);
  }
  local_130 = local_120;
  local_138._M_cur =
       (__node_type *)
       std::
       unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
       ::begin((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                *)in_stack_fffffffffffffae8);
  local_140._M_cur =
       (__node_type *)
       std::
       unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
       ::end((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
              *)in_stack_fffffffffffffae8);
  while (bVar3 = std::__detail::operator!=(&local_138,&local_140), bVar3) {
    local_148 = std::__detail::
                _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                ::operator*((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                             *)0x7d5f12);
    Lib::List<Kernel::Unit_*>::push
              (in_stack_fffffffffffffaf0,(List<Kernel::Unit_*> **)in_stack_fffffffffffffae8);
    std::__detail::
    _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                  *)in_stack_fffffffffffffaf0);
  }
  if ((local_29 & 1) == 0) {
    local_44a = FREE_VAR_INDUCTION_HYPERRESOLUTION;
    if (in_stack_00000010 == 0) {
      local_44a = INDUCTION_HYPERRESOLUTION;
    }
    local_449 = local_44a;
  }
  else {
    local_449 = GEN_INDUCTION_HYPERRESOLUTION;
  }
  Kernel::GeneratingInferenceMany::GeneratingInferenceMany(&local_188,local_449,local_118);
  Kernel::Inference::Inference((Inference *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           in_stack_fffffffffffffaf0);
  Kernel::Clause::iterLits(in_stack_fffffffffffffb00);
  local_1a0 = local_1b8;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_fffffffffffffae8);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)in_stack_fffffffffffffae8);
  do {
    bVar3 = Lib::operator!=((StlIter *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    if (!bVar3) {
      local_2b0 = local_120;
      local_2b8._M_cur =
           (__node_type *)
           std::
           unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
           ::begin((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                    *)in_stack_fffffffffffffae8);
      local_2c0._M_cur =
           (__node_type *)
           std::
           unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
           ::end((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                  *)in_stack_fffffffffffffae8);
      do {
        bVar3 = std::__detail::operator!=(&local_2b8,&local_2c0);
        if (!bVar3) {
          this = (RobSubstitution *)
                 Lib::
                 Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 ::operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                              *)0x7d6877);
          local_408[0]._ptr2 = local_178._ptr2;
          local_408[0].th_ancestors = local_178.th_ancestors;
          local_408[0].all_ancestors = local_178.all_ancestors;
          local_408[0]._splits = local_178._splits;
          local_408[0]._ptr1 = local_178._ptr1;
          local_408[0]._0_8_ = local_178._0_8_;
          local_408[0]._8_4_ = local_178._8_4_;
          local_408[0]._age = local_178._age;
          pCVar9 = Kernel::Clause::fromStack(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
          Kernel::Inference::~Inference(local_408);
          local_364 = 1;
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)in_stack_fffffffffffffb30);
          Kernel::Inference::~Inference(&local_178);
          Kernel::RobSubstitution::~RobSubstitution(this);
          return pCVar9;
        }
        local_2c8 = std::__detail::
                    _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                    ::operator*((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                                 *)0x7d648f);
        for (local_2cc = 0; uVar1 = local_2cc, uVar5 = Kernel::Clause::length(local_2c8->first),
            uVar1 < uVar5; local_2cc = local_2cc + 1) {
          local_2cd = 1;
          local_2d8 = &local_2c8->second;
          local_2e0 = Lib::Stack<Kernel::Literal_*>::begin(local_2d8);
          local_2e8 = Lib::Stack<Kernel::Literal_*>::end(local_2d8);
          for (; local_2e0 != local_2e8; local_2e0 = local_2e0 + 1) {
            local_2f0 = local_2e0;
            getContextReplacementMap
                      (in_stack_fffffffffffffb78,SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
            TermReplacement::TermReplacement
                      ((TermReplacement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
            std::
            map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
            ::~map((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                    *)0x7d6597);
            in_stack_fffffffffffffb28 =
                 Kernel::TermTransformerCommon::transformLiteral
                           ((TermTransformerCommon *)in_stack_fffffffffffffaf0,
                            (Literal *)in_stack_fffffffffffffae8);
            local_360 = in_stack_fffffffffffffb28;
            in_stack_fffffffffffffb30 =
                 (Literal *)Kernel::Clause::operator[](local_2c8->first,local_2cc);
            if (in_stack_fffffffffffffb28 ==
                (Literal *)(in_stack_fffffffffffffb30->super_Term)._vptr_Term) {
              local_2cd = 0;
              local_364 = 0x11;
            }
            else {
              local_364 = 0;
            }
            TermReplacement::~TermReplacement((TermReplacement *)in_stack_fffffffffffffaf0);
            if (local_364 != 0) break;
          }
          if ((local_2cd & 1) != 0) {
            ppLVar8 = Kernel::Clause::operator[](local_2c8->first,local_2cc);
            local_370 = *ppLVar8;
            if (in_stack_00000010 != 0) {
              Kernel::Clause::operator[](local_2c8->first,local_2cc);
              local_370 = Kernel::SubstHelper::apply<Kernel::Substitution>
                                    (in_stack_fffffffffffffb30,
                                     (Substitution *)in_stack_fffffffffffffb28);
              getContextReplacementMap
                        (in_stack_fffffffffffffb78,SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0)
                        );
              TermReplacement::TermReplacement
                        ((TermReplacement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
              std::
              map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
              ::~map((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                      *)0x7d6772);
              local_370 = Kernel::TermTransformerCommon::transformLiteral
                                    ((TermTransformerCommon *)in_stack_fffffffffffffaf0,
                                     (Literal *)in_stack_fffffffffffffae8);
              TermReplacement::~TermReplacement((TermReplacement *)in_stack_fffffffffffffaf0);
            }
            in_stack_fffffffffffffb00 =
                 (Clause *)
                 Lib::
                 Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                               *)0x7d6803);
            in_stack_fffffffffffffaf8 =
                 (map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                  *)Kernel::RobSubstitution::apply
                              (in_stack_fffffffffffffb68,(Literal *)in_stack_fffffffffffffb60,
                               (int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
            Lib::Stack<Kernel::Literal_*>::push
                      ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffaf0,
                       (Literal *)in_stack_fffffffffffffae8);
          }
        }
        std::__detail::
        _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
        ::operator++((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                      *)in_stack_fffffffffffffaf0);
      } while( true );
    }
    ppLVar7 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
              ::StlIter::operator*((StlIter *)0x7d606f);
    local_1e0 = (RobSubstitution *)*ppLVar7;
    Kernel::Literal::complementaryLiteral((Literal *)in_stack_fffffffffffffaf0);
    local_1e8 = (InductionContext *)
                Kernel::SubstHelper::apply<Kernel::Substitution>
                          (in_stack_fffffffffffffb30,(Substitution *)in_stack_fffffffffffffb28);
    local_1e9 = 0;
    local_1f8 = local_120;
    local_200._M_cur =
         (__node_type *)
         std::
         unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
         ::begin((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                  *)in_stack_fffffffffffffae8);
    local_208._M_cur =
         (__node_type *)
         std::
         unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
         ::end((unordered_map<Kernel::Clause_*,_Lib::Stack<Kernel::Literal_*>,_Inferences::StlClauseHash,_std::equal_to<Kernel::Clause_*>,_std::allocator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>_>_>
                *)in_stack_fffffffffffffae8);
    while (bVar3 = std::__detail::operator!=(&local_200,&local_208), bVar3) {
      local_210 = std::__detail::
                  _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                  ::operator*((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                               *)0x7d613f);
      local_218 = &local_210->second;
      local_220 = Lib::Stack<Kernel::Literal_*>::begin(local_218);
      local_228 = Lib::Stack<Kernel::Literal_*>::end(local_218);
      for (; local_220 != local_228; local_220 = local_220 + 1) {
        local_230 = local_220;
        if (in_stack_00000010 == 0) {
          in_stack_fffffffffffffb78 = (InductionContext *)*local_220;
        }
        else {
          in_stack_fffffffffffffb78 =
               (InductionContext *)
               Kernel::SubstHelper::apply<Kernel::Substitution>
                         (in_stack_fffffffffffffb30,(Substitution *)in_stack_fffffffffffffb28);
        }
        local_238 = in_stack_fffffffffffffb78;
        if (in_stack_fffffffffffffb78 == local_1e8) {
          local_1e9 = 1;
          break;
        }
      }
      if ((local_1e9 & 1) != 0) break;
      std::__detail::
      _Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<Kernel::Clause_*const,_Lib::Stack<Kernel::Literal_*>_>,_false,_true>
                    *)in_stack_fffffffffffffaf0);
    }
    if ((local_1e9 & 1) == 0) {
      if ((local_2a & 1) == 0) {
        local_240 = local_1e0;
      }
      else {
        getContextReplacementMap
                  (in_stack_fffffffffffffb78,SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
        TermReplacement::TermReplacement
                  ((TermReplacement *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        std::
        map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
        ::~map((map<Kernel::Term_*,_Kernel::TermList,_std::less<Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*const,_Kernel::TermList>_>_>
                *)0x7d6316);
        in_stack_fffffffffffffb70 =
             Kernel::SubstHelper::apply<Kernel::Substitution>
                       (in_stack_fffffffffffffb30,(Substitution *)in_stack_fffffffffffffb28);
        in_stack_fffffffffffffb68 =
             (RobSubstitution *)
             Kernel::TermTransformerCommon::transformLiteral
                       ((TermTransformerCommon *)in_stack_fffffffffffffaf0,
                        (Literal *)in_stack_fffffffffffffae8);
        local_240 = in_stack_fffffffffffffb68;
        TermReplacement::~TermReplacement((TermReplacement *)in_stack_fffffffffffffaf0);
      }
      iVar4 = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
      in_stack_fffffffffffffb60 =
           Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *)0x7d63dc);
      in_stack_fffffffffffffb58 =
           (Inference *)
           Kernel::RobSubstitution::apply
                     (in_stack_fffffffffffffb68,(Literal *)in_stack_fffffffffffffb60,iVar4);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffaf0,
                 (Literal *)in_stack_fffffffffffffae8);
    }
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffaf0);
  } while( true );
}

Assistant:

Clause* resolveClausesHelper(const InductionContext& context, const Stack<Clause*>& cls, IntUnionFind::ElementIterator eIt, Substitution& subst, bool generalized, bool applySubst, Substitution* indLitSubst)
{
  // first create the clause with the required size
  RobSubstitution renaming;
  ASS(eIt.hasNext());
  auto cl = cls[eIt.next()];
  auto premises = UnitList::singleton(cl);
  const auto& toResolve = context._cls;
  while (eIt.hasNext()) {
    auto other = cls[eIt.next()];
    UnitList::push(other,premises);
  }

  for (const auto& kv : toResolve) {
    UnitList::push(kv.first, premises);
  }

  Inference inf(GeneratingInferenceMany(
    generalized ? InferenceRule::GEN_INDUCTION_HYPERRESOLUTION
                : ( indLitSubst ? InferenceRule::FREE_VAR_INDUCTION_HYPERRESOLUTION : InferenceRule::INDUCTION_HYPERRESOLUTION),
    premises));
  RStack<Literal*> resLits;

  for (Literal* curr : cl->iterLits()) {
    auto clit = SubstHelper::apply<Substitution>(Literal::complementaryLiteral(curr), subst);
    bool contains = false;
    for (const auto& kv : toResolve) {
      for (const auto& lit : kv.second) {
        Literal* slit = indLitSubst ? SubstHelper::apply<Substitution>(lit, *indLitSubst) : lit;
        if (slit == clit) {
          contains = true;
          break;
        }
      }
      if (contains) {
        break;
      }
    }
    if (!contains) {
      Literal* resLit;
      if (applySubst) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        resLit = tr.transformLiteral(SubstHelper::apply<Substitution>(curr,subst));
      } else {
        resLit = curr;
      }
      resLits->push(renaming.apply(resLit,0));
    }
  }

  for (const auto& kv : toResolve) {
    for (unsigned i = 0; i < kv.first->length(); i++) {
      bool copyCurr = true;
      for (const auto& lit : kv.second) {
        TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
        auto rlit = tr.transformLiteral(lit);
        if (rlit == (*kv.first)[i]) {
          copyCurr = false;
          break;
        }
      }
      if (copyCurr) {
        Literal* l = (*kv.first)[i];
        if (indLitSubst) {
          l = SubstHelper::apply<Substitution>((*kv.first)[i], *indLitSubst);
          TermReplacement tr(getContextReplacementMap(context, /*inverse=*/true));
          l = tr.transformLiteral(l);
        }
        resLits->push(renaming.apply(l,1));
      }
    }
  }

  return Clause::fromStack(*resLits, inf);
}